

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Abc_Nam_t *pAVar7;
  Acb_Man_t *p;
  Acb_Ntk_t *p_00;
  int *__ptr;
  void *__s;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  Abc_Nam_t *pAVar11;
  byte bVar12;
  Abc_Nam_t *pStrs;
  Acb_ObjType_t Type;
  int iVar13;
  int iVar14;
  int iVar15;
  uint *puVar16;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  long lVar17;
  long lVar18;
  long lVar19;
  uint *puVar20;
  Hash_IntMan_t *in_R9;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  uint *puVar27;
  int Ent_4;
  ulong uVar28;
  int local_34;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  pAVar11 = (Abc_Nam_t *)vWeights;
  pAVar7 = Abc_NamRef(pNames);
  p = Acb_ManAlloc(pFileName,(int)pAVar7,pStrs,pAVar11,pMods,in_R9);
  pAVar11 = p->pStrs;
  iVar24 = 0;
  iVar2 = Abc_NamStrFindOrAdd(pAVar11,p->pName,(int *)0x0);
  iVar3 = Abc_NamStrFind(pAVar11,"1\'b0");
  lVar26 = *(long *)((long)pModule + 0x10);
  iVar10 = *(int *)(lVar26 + 8) + 2;
  iVar15 = 0;
  iVar13 = 0;
  if (3 < iVar10) {
    lVar22 = *(long *)((long)pModule + 8);
    iVar13 = 3;
    iVar15 = 0;
    do {
      lVar17 = (long)iVar13;
      bVar12 = *(byte *)(lVar22 + lVar17);
      if (bVar12 == 3) {
        for (iVar24 = iVar13 + 1; iVar24 < *(int *)(lVar26 + lVar17 * 4) + iVar13;
            iVar24 = iVar24 + iVar14) {
          lVar19 = (long)iVar24;
          bVar1 = *(byte *)(lVar22 + lVar19);
          if (bVar1 == 6) {
            iVar15 = iVar15 + (uint)(*(int *)(lVar26 + lVar19 * 4) == 3);
            goto LAB_0038f235;
          }
          if (bVar1 == 0) goto LAB_0038ff9e;
          iVar14 = 1;
          if (bVar1 < 4) {
            iVar14 = *(int *)(lVar26 + lVar19 * 4);
          }
        }
        iVar15 = iVar15 + 1;
      }
      else if (bVar12 == 0) goto LAB_0038ff9e;
LAB_0038f235:
      iVar24 = 1;
      if (bVar12 < 4) {
        iVar24 = *(int *)(lVar26 + lVar17 * 4);
      }
      iVar13 = iVar13 + iVar24;
    } while (iVar13 < iVar10);
    iVar13 = 3;
    iVar24 = 0;
    do {
      lVar17 = (long)iVar13;
      bVar12 = *(byte *)(lVar22 + lVar17);
      if (bVar12 == 3) {
        for (iVar14 = iVar13 + 1; iVar14 < *(int *)(lVar26 + lVar17 * 4) + iVar13;
            iVar14 = iVar14 + iVar25) {
          lVar19 = (long)iVar14;
          bVar1 = *(byte *)(lVar22 + lVar19);
          if (bVar1 == 6) {
            iVar24 = iVar24 + (uint)(*(int *)(lVar26 + lVar19 * 4) == 4);
            goto LAB_0038f2b8;
          }
          if (bVar1 == 0) goto LAB_0038ff9e;
          iVar25 = 1;
          if (bVar1 < 4) {
            iVar25 = *(int *)(lVar26 + lVar19 * 4);
          }
        }
        iVar24 = iVar24 + 1;
      }
      else if (bVar12 == 0) goto LAB_0038ff9e;
LAB_0038f2b8:
      iVar14 = 1;
      if (bVar12 < 4) {
        iVar14 = *(int *)(lVar26 + lVar17 * 4);
      }
      iVar13 = iVar13 + iVar14;
    } while (iVar13 < iVar10);
    iVar14 = 3;
    iVar13 = 0;
    do {
      bVar12 = *(byte *)(lVar22 + iVar14);
      if (bVar12 == 0) goto LAB_0038ff9e;
      iVar25 = 1;
      if (bVar12 < 4) {
        iVar25 = *(int *)(lVar26 + (long)iVar14 * 4);
      }
      iVar13 = iVar13 + (uint)(bVar12 == 3);
      iVar14 = iVar14 + iVar25;
    } while (iVar14 < iVar10);
  }
  p_00 = Acb_NtkAlloc(p,iVar2,iVar15,iVar24,iVar13);
  __ptr = (int *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < nNameIdMax - 1U) {
    iVar2 = nNameIdMax;
  }
  *__ptr = iVar2;
  if (iVar2 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = nNameIdMax;
LAB_0038f387:
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar2 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = nNameIdMax;
    if (__s == (void *)0x0) goto LAB_0038f387;
    memset(__s,0,(long)nNameIdMax << 2);
  }
  uVar4 = (p_00->vObjType).nCap;
  if ((p_00->vObjWeight).nCap < (int)uVar4) {
    piVar8 = (p_00->vObjWeight).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar4 << 2);
    }
    (p_00->vObjWeight).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0039008f;
    (p_00->vObjWeight).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vObjWeight).pArray,0,(ulong)uVar4 * 4);
  }
  (p_00->vObjWeight).nSize = uVar4;
  uVar4 = (p_00->vObjType).nCap;
  if ((p_00->vObjName).nCap < (int)uVar4) {
    piVar8 = (p_00->vObjName).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar4 << 2);
    }
    (p_00->vObjName).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0039008f:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vObjName).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vObjName).pArray,0,(ulong)uVar4 * 4);
  }
  (p_00->vObjName).nSize = uVar4;
  lVar26 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar26 + 8) + 2) {
    lVar22 = *(long *)((long)pModule + 8);
    iVar2 = 3;
LAB_0038f481:
    lVar17 = (long)iVar2;
    bVar12 = *(byte *)(lVar22 + lVar17);
    if (bVar12 != 3) {
      if (bVar12 != 0) goto LAB_0038f5d9;
      goto LAB_0038ff9e;
    }
    iVar10 = iVar2 + 1;
    iVar13 = *(int *)(lVar26 + lVar17 * 4) + iVar2;
    iVar15 = iVar10;
    if (iVar10 < iVar13) {
      do {
        lVar19 = (long)iVar15;
        bVar12 = *(byte *)(lVar22 + lVar19);
        if (bVar12 == 6) {
          if (*(int *)(lVar26 + lVar19 * 4) != 3) {
            lVar26 = *(long *)((long)pModule + 0x10);
            goto LAB_0038f5f5;
          }
          break;
        }
        if (bVar12 == 0) goto LAB_0038ff9e;
        iVar24 = 1;
        if (bVar12 < 4) {
          iVar24 = *(int *)(lVar26 + lVar19 * 4);
        }
        iVar15 = iVar15 + iVar24;
      } while (iVar15 < iVar13);
      do {
        lVar19 = (long)iVar10;
        bVar12 = *(byte *)(lVar22 + lVar19);
        if (bVar12 == 5) goto LAB_0038f51d;
        if (bVar12 == 0) goto LAB_0038ff9e;
        iVar15 = 1;
        if (bVar12 < 4) {
          iVar15 = *(int *)(lVar26 + lVar19 * 4);
        }
        iVar10 = iVar10 + iVar15;
        if (iVar13 <= iVar10) break;
      } while( true );
    }
    Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar22);
    goto LAB_0038ffcc;
  }
  goto LAB_0038ff08;
LAB_0038f51d:
  iVar10 = *(int *)(lVar26 + lVar19 * 4);
  lVar26 = (long)iVar10;
  uVar4 = Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar22);
  if ((lVar26 < 0) || (nNameIdMax <= iVar10)) goto LAB_0038ffcc;
  *(uint *)((long)__s + lVar26 * 4) = uVar4;
  if ((int)uVar4 < 1) goto LAB_00390013;
  uVar6 = (p_00->vObjName).nSize;
  if ((int)uVar6 < 1) goto LAB_0039000a;
  if (uVar6 <= uVar4) goto LAB_003900c1;
  piVar8 = (p_00->vObjName).pArray;
  if (piVar8[uVar4] != 0) goto LAB_0038ffeb;
  piVar8[uVar4] = iVar10;
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar10 = 1;
  }
  else {
    if (vWeights->nSize <= iVar10) goto LAB_003900c1;
    iVar10 = vWeights->pArray[lVar26];
  }
  uVar6 = (p_00->vObjWeight).nSize;
  if ((int)uVar6 < 1) goto LAB_00390051;
  if (uVar6 <= uVar4) goto LAB_003900c1;
  piVar8 = (p_00->vObjWeight).pArray;
  if (piVar8[uVar4] != 0) goto LAB_00390032;
  piVar8[uVar4] = iVar10;
  lVar22 = *(long *)((long)pModule + 8);
  bVar12 = *(byte *)(lVar22 + lVar17);
LAB_0038f5d9:
  if (bVar12 == 0) goto LAB_0038ff9e;
  lVar26 = *(long *)((long)pModule + 0x10);
  iVar10 = 1;
  if (bVar12 < 4) {
LAB_0038f5f5:
    iVar10 = *(int *)(lVar26 + lVar17 * 4);
  }
  iVar2 = iVar2 + iVar10;
  iVar10 = *(int *)(lVar26 + 8) + 2;
  if (iVar10 <= iVar2) goto code_r0x0038f609;
  goto LAB_0038f481;
code_r0x0038f609:
  if (3 < iVar10) {
    lVar22 = *(long *)((long)pModule + 8);
    iVar2 = 3;
    do {
      lVar17 = (long)iVar2;
      bVar12 = *(byte *)(lVar22 + lVar17);
      if (bVar12 == 10) {
        iVar10 = *(int *)(lVar26 + lVar17 * 4);
        uVar4 = Acb_ObjAlloc(p_00,ABC_OPER_CONST_F,0,(int)lVar22);
        if (((long)iVar10 < 0) || (nNameIdMax <= iVar10)) goto LAB_0038ffcc;
        *(uint *)((long)__s + (long)iVar10 * 4) = uVar4;
        if ((int)uVar4 < 1) goto LAB_00390013;
        uVar6 = (p_00->vObjName).nSize;
        if ((int)uVar6 < 1) goto LAB_0039000a;
        if (uVar6 <= uVar4) goto LAB_003900c1;
        piVar8 = (p_00->vObjName).pArray;
        if (piVar8[uVar4] != 0) goto LAB_0038ffeb;
        piVar8[uVar4] = iVar10;
        Vec_IntPush(&p_00->vTargets,uVar4);
        lVar22 = *(long *)((long)pModule + 8);
        bVar12 = *(byte *)(lVar22 + lVar17);
      }
      else if (bVar12 == 0) goto LAB_0038ff9e;
      if (bVar12 == 0) goto LAB_0038ff9e;
      lVar26 = *(long *)((long)pModule + 0x10);
      iVar10 = 1;
      if (bVar12 < 4) {
        iVar10 = *(int *)(lVar26 + lVar17 * 4);
      }
      iVar2 = iVar2 + iVar10;
      iVar10 = *(int *)(lVar26 + 8) + 2;
    } while (iVar2 < iVar10);
    if (3 < iVar10) {
      lVar22 = *(long *)((long)pModule + 8);
      iVar2 = 3;
LAB_0038f6f5:
      lVar17 = (long)iVar2;
      bVar12 = *(byte *)(lVar22 + lVar17);
      if (bVar12 == 3) {
        iVar13 = *(int *)(lVar26 + lVar17 * 4) + iVar2;
        iVar10 = iVar2 + 1;
        for (iVar15 = iVar10; iVar15 < iVar13; iVar15 = iVar15 + iVar24) {
          lVar19 = (long)iVar15;
          bVar12 = *(byte *)(lVar22 + lVar19);
          if (bVar12 == 6) {
            iVar15 = iVar10;
            if (*(int *)(lVar26 + lVar19 * 4) != 3) goto LAB_0038f772;
            break;
          }
          if (bVar12 == 0) goto LAB_0038ff9e;
          iVar24 = 1;
          if (bVar12 < 4) {
            iVar24 = *(int *)(lVar26 + lVar19 * 4);
          }
        }
        goto LAB_0038f7a9;
      }
      if (bVar12 != 0) goto LAB_0038f70a;
      goto LAB_0038ff9e;
    }
  }
  goto LAB_0038ff08;
  while( true ) {
    if (bVar12 == 0) goto LAB_0038ff9e;
    iVar24 = 1;
    if (bVar12 < 4) {
      iVar24 = *(int *)(lVar26 + lVar19 * 4);
    }
    iVar15 = iVar15 + iVar24;
    if (iVar13 <= iVar15) break;
LAB_0038f772:
    lVar19 = (long)iVar15;
    bVar12 = *(byte *)(lVar22 + lVar19);
    if (bVar12 == 6) {
      iVar15 = iVar10;
      if (*(int *)(lVar26 + lVar19 * 4) != 4) goto LAB_0038f7c8;
      break;
    }
  }
LAB_0038f7a9:
  lVar26 = *(long *)((long)pModule + 0x10);
  goto LAB_0038f7ad;
  while( true ) {
    if (bVar12 == 0) goto LAB_0038ff9e;
    iVar24 = 1;
    if (bVar12 < 4) {
      iVar24 = *(int *)(lVar26 + lVar19 * 4);
    }
    iVar15 = iVar15 + iVar24;
    if (iVar13 <= iVar15) break;
LAB_0038f7c8:
    lVar19 = (long)iVar15;
    bVar12 = *(byte *)(lVar22 + lVar19);
    if (bVar12 == 5) {
      uVar4 = *(uint *)(lVar26 + lVar19 * 4);
      goto LAB_0038f801;
    }
  }
  uVar4 = 0xffffffff;
LAB_0038f801:
  lVar19 = 0;
  lVar18 = 0;
  iVar24 = 0;
  iVar15 = iVar10;
  do {
    lVar23 = (long)iVar15;
    bVar12 = *(byte *)(lVar22 + lVar23);
    if (bVar12 == 4) {
      iVar24 = iVar24 + 1;
      lVar23 = lVar26 + lVar23 * 4;
      if (lVar18 == 0) {
        lVar18 = lVar23;
        lVar19 = lVar23;
      }
      iVar14 = 1;
    }
    else {
      if (bVar12 == 0) goto LAB_0038ff9e;
      if (lVar19 != 0) break;
      if (bVar12 == 0) goto LAB_0038ff9e;
      if (bVar12 < 4) {
        iVar14 = *(int *)(lVar26 + lVar23 * 4);
      }
      else {
        iVar14 = 1;
      }
      lVar19 = 0;
      lVar18 = 0;
    }
    iVar15 = iVar15 + iVar14;
  } while (iVar15 < iVar13);
  do {
    lVar19 = (long)iVar10;
    bVar12 = *(byte *)(lVar22 + lVar19);
    if (bVar12 == 6) {
      Type = *(Acb_ObjType_t *)(lVar26 + lVar19 * 4);
      goto LAB_0038f8a3;
    }
    if (bVar12 == 0) goto LAB_0038ff9e;
    iVar15 = 1;
    if (bVar12 < 4) {
      iVar15 = *(int *)(lVar26 + lVar19 * 4);
    }
    iVar10 = iVar10 + iVar15;
  } while (iVar10 < iVar13);
  Type = ~ABC_OPER_NONE;
LAB_0038f8a3:
  uVar6 = Acb_ObjAlloc(p_00,Type,iVar24,(int)lVar22);
  if (((int)uVar4 < 0) || (nNameIdMax <= (int)uVar4)) goto LAB_0038ffcc;
  *(uint *)((long)__s + (ulong)uVar4 * 4) = uVar6;
  if ((int)uVar6 < 1) goto LAB_00390013;
  uVar5 = (p_00->vObjName).nSize;
  if ((int)uVar5 < 1) goto LAB_0039000a;
  if (uVar5 <= uVar6) goto LAB_003900c1;
  piVar8 = (p_00->vObjName).pArray;
  if (piVar8[uVar6] != 0) goto LAB_0038ffeb;
  piVar8[uVar6] = uVar4;
  lVar22 = *(long *)((long)pModule + 8);
  bVar12 = *(byte *)(lVar22 + lVar17);
LAB_0038f70a:
  if (bVar12 == 0) goto LAB_0038ff9e;
  lVar26 = *(long *)((long)pModule + 0x10);
  iVar10 = 1;
  if (3 < bVar12) goto LAB_0038f7b1;
LAB_0038f7ad:
  iVar10 = *(int *)(lVar26 + lVar17 * 4);
LAB_0038f7b1:
  iVar2 = iVar2 + iVar10;
  iVar10 = *(int *)(lVar26 + 8) + 2;
  if (iVar10 <= iVar2) goto LAB_0038f90e;
  goto LAB_0038f6f5;
LAB_00390013:
  pcVar9 = "i>0";
  goto LAB_0039001a;
LAB_0038f90e:
  if (3 < iVar10) {
    lVar22 = *(long *)((long)pModule + 8);
    iVar2 = 3;
LAB_0038f920:
    lVar17 = (long)iVar2;
    bVar12 = *(byte *)(lVar22 + lVar17);
    if (bVar12 == 3) {
      iVar13 = *(int *)(lVar26 + lVar17 * 4) + iVar2;
      iVar10 = iVar2 + 1;
      for (iVar15 = iVar10; iVar15 < iVar13; iVar15 = iVar15 + iVar24) {
        lVar19 = (long)iVar15;
        bVar12 = *(byte *)(lVar22 + lVar19);
        if (bVar12 == 6) {
          iVar15 = iVar10;
          if (*(int *)(lVar26 + lVar19 * 4) != 3) goto LAB_0038f99d;
          break;
        }
        if (bVar12 == 0) goto LAB_0038ff9e;
        iVar24 = 1;
        if (bVar12 < 4) {
          iVar24 = *(int *)(lVar26 + lVar19 * 4);
        }
      }
      goto LAB_0038f9d3;
    }
    if (bVar12 != 0) goto LAB_0038f934;
    goto LAB_0038ff9e;
  }
  goto LAB_0038ff08;
  while( true ) {
    if (bVar12 == 0) goto LAB_0038ff9e;
    iVar24 = 1;
    if (bVar12 < 4) {
      iVar24 = *(int *)(lVar26 + lVar19 * 4);
    }
    iVar15 = iVar15 + iVar24;
    if (iVar13 <= iVar15) break;
LAB_0038f99d:
    lVar19 = (long)iVar15;
    bVar12 = *(byte *)(lVar22 + lVar19);
    if (bVar12 == 6) {
      iVar15 = iVar10;
      if (*(int *)(lVar26 + lVar19 * 4) != 4) goto LAB_0038f9f2;
      break;
    }
  }
LAB_0038f9d3:
  lVar26 = *(long *)((long)pModule + 0x10);
  goto LAB_0038f9d7;
LAB_0038f9f2:
  lVar19 = (long)iVar15;
  bVar12 = *(byte *)(lVar22 + lVar19);
  if (bVar12 == 5) goto LAB_0038fa25;
  if (bVar12 == 0) goto LAB_0038ff9e;
  iVar24 = 1;
  if (bVar12 < 4) {
    iVar24 = *(int *)(lVar26 + lVar19 * 4);
  }
  iVar15 = iVar15 + iVar24;
  if (iVar13 <= iVar15) {
    Abc_NamStr(p->pStrs,-1);
    goto LAB_003900c1;
  }
  goto LAB_0038f9f2;
LAB_0038fa25:
  iVar15 = *(int *)(lVar26 + lVar19 * 4);
  lVar26 = (long)iVar15;
  pcVar9 = Abc_NamStr(p->pStrs,iVar15);
  if ((lVar26 < 0) || (nNameIdMax <= iVar15)) goto LAB_003900c1;
  uVar4 = *(uint *)((long)__s + lVar26 * 4);
  lVar22 = *(long *)((long)pModule + 0x10);
  iVar13 = *(int *)(lVar22 + lVar17 * 4) + iVar2;
  if (iVar10 < iVar13) {
    lVar23 = 0;
    lVar19 = 0;
    lVar18 = 0;
    uVar6 = 0;
    do {
      lVar21 = (long)iVar10;
      bVar12 = *(byte *)(*(long *)((long)pModule + 8) + lVar21);
      if (bVar12 == 4) {
        uVar6 = uVar6 + 1;
        iVar24 = 1;
        if (lVar18 == 0) {
          lVar19 = lVar22 + lVar21 * 4;
          lVar18 = lVar19;
          lVar23 = lVar19;
        }
      }
      else {
        if (bVar12 == 0) goto LAB_0038ff9e;
        if (lVar19 != 0) break;
        if (bVar12 == 0) goto LAB_0038ff9e;
        if (bVar12 < 4) {
          iVar24 = *(int *)(lVar22 + lVar21 * 4);
        }
        else {
          iVar24 = 1;
        }
        lVar19 = 0;
        lVar18 = 0;
      }
      iVar10 = iVar10 + iVar24;
    } while (iVar10 < iVar13);
    if (0 < (int)uVar6) {
      uVar28 = 0;
      do {
        uVar5 = *(uint *)(lVar23 + uVar28 * 4);
        if (((long)(int)uVar5 < 0) || (nNameIdMax <= (int)uVar5)) goto LAB_003900c1;
        if (*(int *)((long)__s + (long)(int)uVar5 * 4) == 0) {
          printf("Cannot find fanin %d of node \"%s\".\n",uVar28 & 0xffffffff,pcVar9);
          uVar5 = *(uint *)(lVar23 + uVar28 * 4);
        }
        if (((int)uVar5 < 0) || (nNameIdMax <= (int)uVar5)) goto LAB_003900c1;
        if ((int)uVar4 < 1) goto LAB_003900ff;
        if ((p_00->vObjFans).nSize <= (int)uVar4) goto LAB_003900c1;
        iVar10 = (p_00->vObjFans).pArray[uVar4];
        if (((long)iVar10 < 0) || ((p_00->vFanSto).nSize <= iVar10)) goto LAB_00390070;
        iVar13 = *(int *)((long)__s + (ulong)uVar5 * 4);
        if (iVar13 < 1) goto LAB_0039011e;
        piVar8 = (p_00->vFanSto).pArray + iVar10;
        iVar10 = *piVar8;
        if (piVar8[(long)iVar10 + 1] != -1) goto LAB_0039013d;
        *piVar8 = iVar10 + 1;
        piVar8[(long)iVar10 + 1] = iVar13;
        uVar28 = uVar28 + 1;
      } while (uVar6 != uVar28);
    }
  }
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar10 = 1;
  }
  else {
    if (vWeights->nSize <= iVar15) goto LAB_003900c1;
    iVar10 = vWeights->pArray[lVar26];
  }
  if ((int)uVar4 < 1) {
    pcVar9 = "i>0";
    goto LAB_00390058;
  }
  uVar6 = (p_00->vObjWeight).nSize;
  if ((int)uVar6 < 1) goto LAB_00390051;
  if (uVar6 <= uVar4) goto LAB_003900c1;
  piVar8 = (p_00->vObjWeight).pArray;
  if (piVar8[uVar4] != 0) {
LAB_00390032:
    __assert_fail("Acb_ObjWeight(p, i)== 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x11c,"void Acb_ObjSetWeight(Acb_Ntk_t *, int, int)");
  }
  piVar8[uVar4] = iVar10;
  lVar22 = *(long *)((long)pModule + 8);
  bVar12 = *(byte *)(lVar22 + lVar17);
LAB_0038f934:
  if (bVar12 == 0) goto LAB_0038ff9e;
  lVar26 = *(long *)((long)pModule + 0x10);
  iVar10 = 1;
  if (3 < bVar12) goto LAB_0038f9da;
LAB_0038f9d7:
  iVar10 = *(int *)(lVar26 + lVar17 * 4);
LAB_0038f9da:
  iVar2 = iVar2 + iVar10;
  iVar10 = *(int *)(lVar26 + 8) + 2;
  if (iVar10 <= iVar2) goto LAB_0038fc39;
  goto LAB_0038f920;
LAB_00390051:
  pcVar9 = "Acb_NtkHasObjWeights(p)";
LAB_00390058:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
LAB_0039000a:
  pcVar9 = "Acb_NtkHasObjNames(p)";
LAB_0039001a:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
LAB_0038fc39:
  if (3 < iVar10) {
    lVar22 = *(long *)((long)pModule + 8);
    iVar2 = 3;
    do {
      lVar17 = (long)iVar2;
      bVar12 = *(byte *)(lVar22 + lVar17);
      if (bVar12 == 3) {
        iVar24 = iVar2 + 1;
        iVar13 = *(int *)(lVar26 + lVar17 * 4) + iVar2;
        iVar10 = -1;
        iVar15 = iVar24;
        if (iVar24 < iVar13) {
          do {
            lVar19 = (long)iVar15;
            bVar12 = *(byte *)(lVar22 + lVar19);
            iVar14 = iVar24;
            if (bVar12 == 6) {
              if (*(int *)(lVar26 + lVar19 * 4) != 4) {
                lVar26 = *(long *)((long)pModule + 0x10);
                goto LAB_0038feec;
              }
              break;
            }
            if (bVar12 == 0) goto LAB_0038ff9e;
            iVar25 = 1;
            if (bVar12 < 4) {
              iVar25 = *(int *)(lVar26 + lVar19 * 4);
            }
            iVar15 = iVar15 + iVar25;
          } while (iVar15 < iVar13);
          do {
            lVar19 = (long)iVar14;
            bVar12 = *(byte *)(lVar22 + lVar19);
            if (bVar12 == 5) {
              iVar10 = *(int *)(lVar26 + lVar19 * 4);
              break;
            }
            if (bVar12 == 0) goto LAB_0038ff9e;
            iVar15 = 1;
            if (bVar12 < 4) {
              iVar15 = *(int *)(lVar26 + lVar19 * 4);
            }
            iVar14 = iVar14 + iVar15;
          } while (iVar14 < iVar13);
        }
        pcVar9 = Abc_NamStr(p->pStrs,iVar10);
        lVar26 = *(long *)((long)pModule + 0x10);
        iVar10 = *(int *)(lVar26 + lVar17 * 4) + iVar2;
        if (iVar10 <= iVar24) {
LAB_003900e0:
          __assert_fail("nArray == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                        ,0xdb,
                        "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)");
        }
        puVar27 = (uint *)0x0;
        puVar16 = (uint *)0x0;
        puVar20 = (uint *)0x0;
        iVar15 = 0;
        do {
          lVar22 = (long)iVar24;
          bVar12 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
          if (bVar12 == 4) {
            iVar15 = iVar15 + 1;
            iVar13 = 1;
            if (puVar20 == (uint *)0x0) {
              puVar16 = (uint *)(lVar26 + lVar22 * 4);
              puVar20 = puVar16;
              puVar27 = puVar16;
            }
          }
          else {
            if (bVar12 == 0) goto LAB_0038ff9e;
            if (puVar16 != (uint *)0x0) break;
            if (bVar12 == 0) goto LAB_0038ff9e;
            if (bVar12 < 4) {
              iVar13 = *(int *)(lVar26 + lVar22 * 4);
            }
            else {
              iVar13 = 1;
            }
            puVar16 = (uint *)0x0;
            puVar20 = (uint *)0x0;
          }
          iVar24 = iVar24 + iVar13;
        } while (iVar24 < iVar10);
        if (iVar15 != 1) goto LAB_003900e0;
        uVar6 = Acb_ObjAlloc(p_00,ABC_OPER_CO,1,iVar10);
        uVar4 = *puVar27;
        if (((long)(int)uVar4 < 0) || (uVar5 = __ptr[1], (int)uVar5 <= (int)uVar4)) {
LAB_003900c1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)((long)__s + (long)(int)uVar4 * 4) == 0) {
          printf("Adding constant 0 driver to non-driven PO \"%s\".\n",pcVar9);
          uVar4 = *puVar27;
          if (((long)(int)uVar4 < 0) || (uVar5 <= uVar4)) {
LAB_0038ffcc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)__s + (long)(int)uVar4 * 4) = iVar3;
          uVar4 = *puVar27;
        }
        if (((int)uVar4 < 0) || (uVar5 <= uVar4)) goto LAB_003900c1;
        if ((int)uVar6 < 1) {
LAB_003900ff:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p_00->vObjFans).nSize <= (int)uVar6) goto LAB_003900c1;
        iVar10 = (p_00->vObjFans).pArray[uVar6];
        if (((long)iVar10 < 0) || ((p_00->vFanSto).nSize <= iVar10)) {
LAB_00390070:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar15 = *(int *)((long)__s + (ulong)uVar4 * 4);
        if (iVar15 < 1) {
LAB_0039011e:
          __assert_fail("iFanin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
        }
        piVar8 = (p_00->vFanSto).pArray + iVar10;
        iVar10 = *piVar8;
        if (piVar8[(long)iVar10 + 1] != -1) {
LAB_0039013d:
          __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
        }
        *piVar8 = iVar10 + 1;
        piVar8[(long)iVar10 + 1] = iVar15;
        uVar4 = (p_00->vObjName).nSize;
        if ((int)uVar4 < 1) goto LAB_0039000a;
        if (uVar4 <= uVar6) goto LAB_003900c1;
        piVar8 = (p_00->vObjName).pArray;
        if (piVar8[uVar6] != 0) {
LAB_0038ffeb:
          __assert_fail("Acb_ObjName(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11e,"void Acb_ObjSetName(Acb_Ntk_t *, int, int)");
        }
        piVar8[uVar6] = *puVar27;
        lVar22 = *(long *)((long)pModule + 8);
        bVar12 = *(byte *)(lVar22 + lVar17);
      }
      else if (bVar12 == 0) {
LAB_0038ff9e:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (bVar12 == 0) goto LAB_0038ff9e;
      lVar26 = *(long *)((long)pModule + 0x10);
      iVar10 = 1;
      if (bVar12 < 4) {
LAB_0038feec:
        iVar10 = *(int *)(lVar26 + lVar17 * 4);
      }
      iVar2 = iVar2 + iVar10;
    } while (iVar2 < *(int *)(lVar26 + 8) + 2);
  }
LAB_0038ff08:
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(__ptr);
  p_00->nRegs = 0;
  pAVar11 = p->pMods;
  pcVar9 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
  iVar2 = Abc_NamStrFindOrAdd(pAVar11,pcVar9,&local_34);
  if (local_34 == 0) {
    if (iVar2 != p_00->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar9 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
    printf("Network with name \"%s\" already exists.\n",pcVar9);
  }
  return p_00;
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    int Token0 = Abc_NamStrFind( pMan->pStrs, "1\'b0" );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
        {
            if ( Vec_IntEntry(vMap, pArray[k]) == 0 )
                printf( "Cannot find fanin %d of node \"%s\".\n", k, pName );
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        }
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        if ( Vec_IntEntry(vMap, pArray[0]) == 0 )
        {
            printf( "Adding constant 0 driver to non-driven PO \"%s\".\n", pName );
            Vec_IntWriteEntry( vMap, pArray[0], Token0 );
        }
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}